

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWISimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
AtmelSWISimulationDataGenerator::CreateSWITransaction
          (AtmelSWISimulationDataGenerator *this,U8 *BlockSent,U8 *BlockReceived)

{
  uint uVar1;
  
  OutputTokenWake(this);
  OutputFlag(this,SWIF_Transmit);
  OutputIOBlock(this,StatusBlock);
  uVar1 = (int)this + 0x18;
  ClockGenerator::AdvanceByTimeS(0.001);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  OutputFlag(this,SWIF_Command);
  OutputIOBlock(this,BlockSent);
  ClockGenerator::AdvanceByTimeS(0.014);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  OutputFlag(this,SWIF_Transmit);
  OutputIOBlock(this,BlockReceived);
  ClockGenerator::AdvanceByTimeS(0.01);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  OutputFlag(this,SWIF_Idle);
  ClockGenerator::AdvanceByTimeS(0.1);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  return;
}

Assistant:

void AtmelSWISimulationDataGenerator::CreateSWITransaction( U8 BlockSent[], U8 BlockReceived[] )
{
    // wake
    OutputTokenWake();

    // get the status
    OutputFlag( SWIF_Transmit );
    OutputIOBlock( StatusBlock );

    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MILLI_SEC * 1 ) );

    // send the command
    OutputFlag( SWIF_Command );
    OutputIOBlock( BlockSent );
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MILLI_SEC * 14 ) );

    // get the response
    OutputFlag( SWIF_Transmit );
    OutputIOBlock( BlockReceived );

    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MILLI_SEC * 10 ) );

    // add the idle flag
    OutputFlag( SWIF_Idle );

    // make a gap
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MILLI_SEC * 100 ) );
}